

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O1

bool __thiscall
GMAA_MAAstarClassic::ConstructAndValuateNextPolicies
          (GMAA_MAAstarClassic *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  BayesianGameIdenticalPayoff *bg;
  size_t *psVar1;
  LIndex *pLVar2;
  size_t sVar3;
  size_t sVar4;
  QFunctionJAOHInterface *q;
  DecPOMDPDiscreteInterface *pDVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  element_type *peVar8;
  bool bVar9;
  int iVar10;
  Index IVar11;
  BayesianGameForDecPOMDPStage *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LIndex i;
  ulong uVar12;
  ostream *poVar13;
  undefined7 extraout_var;
  uint agI;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 extraout_var_02 [56];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  PJPDP_sharedPtr jpolTs;
  PJPPV_sharedPtr jpolPrevTs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  JointPolicyPureVector jpolBG;
  JointPolicyPureVector bestLBjpolBG;
  stringstream ss;
  double local_3d0;
  ulong local_3c8;
  double local_3b8;
  string local_3b0;
  PartialPolicyPoolInterface_sharedPtr *local_390;
  LIndex local_388;
  double local_380;
  double local_378;
  element_type *local_370;
  shared_count local_368;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_360;
  PartialPolicyPoolItemInterface_sharedPtr *local_358;
  size_t local_350;
  double local_348;
  ulong local_340;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  TimedAlgorithm *local_320;
  size_t local_318;
  ulong local_310;
  undefined1 local_308 [8];
  shared_count local_300;
  undefined1 local_2f8 [8];
  shared_count local_2f0;
  undefined1 local_2e8 [56];
  JPolComponent_VectorImplementation local_2b0;
  undefined1 local_250 [152];
  shared_ptr<PartialJointPolicyDiscretePure> local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *cleanUpPPI = true;
  local_390 = poolOfNextPolicies;
  local_358 = ppi;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_1b8);
  boost::dynamic_pointer_cast<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure>
            ((boost *)&local_370,&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  peVar8 = local_370;
  sVar3 = (local_370->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  sVar4 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _m_horizon;
  this_00 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
  q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
  local_1b8.px = peVar8;
  local_1b8.pn.pi_ = local_368.pi_;
  if (local_368.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_368.pi_)->use_count_ = (local_368.pi_)->use_count_ + 1;
    UNLOCK();
  }
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (this_00,(PlanningUnitDecPOMDPDiscrete *)this,q,
             (shared_ptr<const_PartialJointPolicyDiscretePure> *)&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  pDVar5 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
  auVar21 = (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0)) +
                        0x70))((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
  auVar18._0_8_ = auVar21._8_8_;
  auVar18._8_56_ = extraout_var_02;
  auVar7 = vcvtusi2sd_avx512f(auVar18._0_16_,sVar3);
  local_348 = pow(auVar21._0_8_,auVar7._0_8_);
  iVar10 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
             _vptr_PlanningUnit[6])(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_338,CONCAT44(extraout_var_00,iVar10),(allocator_type *)&local_1b8);
  sVar4 = sVar4 - 1;
  agI = 0;
  while( true ) {
    iVar10 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
               _vptr_PlanningUnit[6])(this);
    uVar12 = (ulong)agI;
    if (CONCAT44(extraout_var_01,iVar10) <= uVar12) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)this,agI,(Index)sVar3);
    IVar11 = Globals::CastLIndexToIndex(i);
    if ((ulong)((long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar12) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12)
      ;
    }
    local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = IVar11;
    agI = agI + 1;
  }
  bg = &this_00->super_BayesianGameIdenticalPayoff;
  local_388 = Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
                        ((Interface_ProblemToPolicyDiscretePure *)bg,TYPE_INDEX,999999);
  uVar12 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
  psVar1 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_bgCounter;
  *psVar1 = *psVar1 + 1;
  iVar10 = std::__cxx11::string::compare
                     ((char *)&(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                               super_GeneralizedMAAStarPlanner._m_bgBaseFilename);
  if (iVar10 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,
                         (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                         super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_dataplus._M_p,
                         (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                         super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_string_length);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__cxx11::stringbuf::str();
    BayesianGameIdenticalPayoff::Save(bg,(string *)local_2e8);
    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)local_2e8,(Interface_ProblemToPolicyDiscretePure *)bg);
  if (2 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_GeneralizedMAAStarPlanner
          ._m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"starting on solution of BG for t=",0x21);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," with nrJPols=",0xe);
    poVar13 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"GMAA::NextExact_ts",0x12);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  local_320 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_GeneralizedMAAStarPlanner.super_TimedAlgorithm;
  TimedAlgorithm::StartTimer(local_320,(string *)local_250);
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)local_250,(Interface_ProblemToPolicyDiscretePure *)bg);
  local_350 = sVar3;
  (*(this_00->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[3])(this_00,0);
  local_360 = &(this_00->super_BayesianGameIdenticalPayoff).
               super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  local_380 = -1.79769313486232e+308;
  local_3c8 = 0;
  local_340 = 0;
  local_318 = uVar12;
  do {
    uVar14 = local_3c8;
    if (((-1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_GeneralizedMAAStarPlanner._m_verboseness) &&
        (uVar14 = local_3c8 + 1, 10000 < local_3c8)) && (local_3c8 % 10000 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"BG joint policy",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar13 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," of ",4);
      poVar13 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," - ",3);
      *(undefined8 *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 8) = 4;
      dVar15 = Globals::CastLIndexToDouble(local_3c8);
      dVar16 = Globals::CastLIndexToDouble(local_388);
      poVar13 = std::ostream::_M_insert<double>((dVar15 / dVar16) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    local_3c8 = uVar14;
    auVar18 = ZEXT864(0) << 0x40;
    local_3b8 = 0.0;
    if (uVar12 == 0) {
      local_3d0 = 0.0;
    }
    else {
      local_3d0 = 0.0;
      uVar14 = 0;
      local_3b8 = 0.0;
      do {
        auVar17 = auVar18._0_16_;
        IVar11 = JPolComponent_VectorImplementation::GetJointActionIndex(&local_2b0,(Index)uVar14);
        (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0xd])(bg,uVar14);
        local_378 = auVar17._0_8_;
        (*(this_00->super_BayesianGameForDecPOMDPStageInterface).
          _vptr_BayesianGameForDecPOMDPStageInterface[2])(this_00,uVar14,(ulong)IVar11,0);
        local_310 = auVar17._0_8_;
        (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x10])(bg,uVar14,(ulong)IVar11);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_310;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_378;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_3d0;
        auVar7 = vfmadd213sd_fma(auVar19,auVar20,auVar7);
        local_3d0 = auVar7._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_3b8;
        auVar7 = vfmadd213sd_fma(auVar17,auVar20,auVar21);
        auVar18 = ZEXT1664(auVar7);
        local_3b8 = auVar7._0_8_;
        uVar14 = (ulong)((Index)uVar14 + 1);
      } while (uVar14 < uVar12);
    }
    dVar15 = (local_370->super_PartialJointPolicy)._m_pastReward;
    dVar16 = local_3d0 * local_348 + dVar15;
    if (local_350 == sVar4) {
      if (local_380 < dVar16) {
        JointPolicyPureVector::operator=
                  ((JointPolicyPureVector *)local_250,(JointPolicyPureVector *)local_2e8);
        local_3b8 = dVar16;
        local_380 = dVar16;
      }
      (*local_358->px->_vptr_PartialPolicyPoolItemInterface[3])();
      if (dVar16 < local_3b8 + -1e-08) goto LAB_003d081a;
      if (-1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_GeneralizedMAAStarPlanner._m_verboseness) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"GMAA_MAAstarClassic::ConstructAndValuateNextPolicies",0x34
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Last time step, found tight bound: ",0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"found value v=",0xe);
        dVar15 = dVar16;
        poVar13 = std::ostream::_M_insert<double>(dVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,", parent (upperbound) value=",0x1c);
        (*local_358->px->_vptr_PartialPolicyPoolItemInterface[3])();
        poVar13 = std::ostream::_M_insert<double>(dVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      bVar9 = false;
    }
    else {
      local_378 = dVar15;
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x18])(&local_3b0,this,local_370,local_2e8,local_360,&local_338);
      *(double *)(local_3b0._M_dataplus._M_p + 0x38) = dVar16;
      peVar6 = local_390->px;
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x16])(local_2f8,this,&local_3b0);
      (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_2f8);
      boost::detail::shared_count::~shared_count(&local_2f0);
      boost::detail::shared_count::~shared_count((shared_count *)&local_3b0._M_string_length);
      uVar12 = local_318;
LAB_003d081a:
      bVar9 = JPolComponent_VectorImplementation::Increment(&local_2b0);
      local_340 = CONCAT71(extraout_var,bVar9);
      pLVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_nrJPolBGsEvaluated;
      *pLVar2 = *pLVar2 + 1;
      bVar9 = true;
    }
    if ((!bVar9) || ((local_340 & 1) != 0)) {
      (*(this_00->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[4])(this_00);
      sVar3 = local_350;
      if (local_350 == sVar4) {
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x18])(&local_3b0,this,local_370,local_250,local_360,&local_338);
        *(double *)(local_3b0._M_dataplus._M_p + 0x38) = dVar16;
        peVar6 = local_390->px;
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_380,local_308,this);
        (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_308);
        boost::detail::shared_count::~shared_count(&local_300);
        boost::detail::shared_count::~shared_count((shared_count *)&local_3b0._M_string_length);
      }
      if (1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_verboseness) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Solved BG for t=",0x10);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,". Max. expected value (including ",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"true expected reward up to this ts:",0x23);
        poVar13 = std::ostream::_M_insert<double>
                            ((local_370->super_PartialJointPolicy)._m_pastReward);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,") is:",5);
        (*local_390->px->_vptr_PartialPolicyPoolInterface[4])(&local_3b0);
        dVar15 = (double)(**(code **)(*(long *)local_3b0._M_dataplus._M_p + 0x18))();
        poVar13 = std::ostream::_M_insert<double>(dVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        boost::detail::shared_count::~shared_count((shared_count *)&local_3b0._M_string_length);
      }
      (*(this_00->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[1])(this_00);
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(local_320,&local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)local_250);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)local_2e8);
      if (local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_338.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_338.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      boost::detail::shared_count::~shared_count(&local_368);
      return sVar3 == sVar4;
    }
  } while( true );
}

Assistant:

bool GMAA_MAAstarClassic::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    //return(ConstructAndValuateNextPoliciesExactBG( ppi, poolOfNextPolicies));
    //moved this function here since MAA* is the only GMAA variant that does it
    //in this way...
    PJPPV_sharedPtr jpolPrevTs = 
        boost::dynamic_pointer_cast<PartialJointPolicyPureVector >(ppi->GetJPol());//jpol^ts-1
    size_t depth = jpolPrevTs->GetDepth(); // = depth = ts(jpolPrevTs) + 1
    size_t ts = depth; //jpol = jpol^ts-1, we construct BG for ts == depth
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    // Construct the bayesian game for this timestep - 
    BayesianGameForDecPOMDPStage *bg_ts= new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            );

    double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    LIndex nrJPols = bg_ts->GetNrJointPolicies();
    size_t nrJT = bg_ts->GetNrJointTypes();

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

#if DEBUG_GMAA3
    if(_m_verboseness >= 3) {
        cout << "Constructed BG:"<<endl;
        bg_ts->Print();
    }
#endif


    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts);

    if(_m_verboseness >= 3) 
        cout << "starting on solution of BG for t="<<ts<<" with nrJPols="
            <<nrJPols<<endl;

    stringstream ss;
    ss << "GMAA::NextExact_ts" << ts;
    StartTimer(ss.str());

    //some variables used when this is the last time-step
    double maxLBv = -DBL_MAX;
    JointPolicyPureVector bestLBjpolBG = JointPolicyPureVector(bg_ts);
    double newPastReward = 0.0;
    //we cache the immediate rewards in the BG...
    bg_ts->ComputeAllImmediateRewards();

    /* Do the full enumeration of all joint policies for the BG...*/
    bool carry_over = false;
    LIndex i = 0;
    while(!carry_over)
    {
        if(_m_verboseness >= 0)
            PrintProgress("BG joint policy", i++, nrJPols, 10000);
        //eval the expected future payoff of this jpolBG
        double f = 0.0;        
        double r = 0.0; //immediate reward (exact)
        for(Index jt = 0; jt < nrJT ; jt++)
        {
            Index jaI = jpolBG.GetJointActionIndex(jt);
            double jt_prob = bg_ts->GetProbability(jt);
            double jt_r = bg_ts->GetImmediateReward(jt, jaI);
            r += jt_prob * jt_r;
            double jt_util = bg_ts->GetUtility(jt, jaI);
            f += jt_prob * jt_util;
        }
        //add the expected reward for 0...ts-1
        //NOTE the expected reward has been computed as
        //f = R + gamma * F
        //by the heuristic. That means that f itself is not yet
        //discounted!!:
        double discounted_F = discountToThePowerT * f;
        double v = jpolPrevTs->GetPastReward() + discounted_F;
        // the new past reward:
        double discounted_r = discountToThePowerT * r;

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
                << v <<" = "
                << jpolPrevTs->GetPastReward() <<" + "
                << discounted_F << "   "
                << "(g^t * f ="<<discountToThePowerT << " * " << f << ")"
                << endl;
#endif

        newPastReward = jpolPrevTs->GetPastReward() + discounted_r;
        if(!is_last_ts) 
        {   
            //not the last time step...construct and return all 
            //partial DecPOMDP policies,
            
            // construct a policy for the DecPOMDP: a copy of jpolPrevTs
            // extended to this time step (ts) by jpolBG
            PJPDP_sharedPtr jpolTs = 
                ConstructExtendedJointPolicy(*jpolPrevTs,
                    jpolBG, nrOHts, firstOHtsI);
            jpolTs->SetPastReward(newPastReward);

            // wrap the policy and put it in the pool of next policies.
            // (these next policies are candidates to be added to the 
            // main policy pool)
            // Warning: jpolTs may have been deleted afterwards
            poolOfNextPolicies->Insert( NewPPI(jpolTs, v) );

            // conserve memory 
            // is this necessary?  - this is performed by 
            //      'SelectPoliciesToProcessFurther' 
            // seems like duplicate work...
            //if(poolOfNextPolicies->Size()>(_m_nrPoliciesToProcess*10))
                //Prune(poolOfNextPolicies,_m_nrPoliciesToProcess);
        }
        else
        {   
            //if using a heuristic that does not specify the exact immediate
            //reward, we still want to return the *EXACT* payoff here...
            v = newPastReward;
            //this is the last time step: 
            //  -values are lowerbounds, so if we find a policy with total 
            //      reward equal to the upperbound of the parent (ppi->
            //      GetValue() ) then we can stop evaluating other policies.
            //  -we will only need to return 1 policy and value
            //   (so we do not put them in a pool)
            if(v > maxLBv)
            {
                bestLBjpolBG = jpolBG;
                maxLBv = v;
            }
            if(v >= ppi->GetValue() - 1e-8)
            {
                if(_m_verboseness >= 0) 
                    cout << "GMAA_MAAstarClassic::ConstructAndValuateNextPolicies"<<
                        " Last time step, found tight bound: "<<
                        "found value v="<<v<<", parent (upperbound) value="<<
                        ppi->GetValue() << endl;
                break;
            }
        }
        carry_over = ++jpolBG; //next policy for the BG...
        _m_nrJPolBGsEvaluated++;
    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    //if this is the last time step, we have not constructed the Dec-POMDP
    //policy which will be returned yet, so we do this now:
    if(is_last_ts) 
    {
        PJPDP_sharedPtr jpolTs = ConstructExtendedJointPolicy(
                *jpolPrevTs,
                bestLBjpolBG, 
                nrOHts, 
                firstOHtsI
                );
        jpolTs->SetPastReward(newPastReward);
        // Warning: jpolTs may have been deleted afterwards
        poolOfNextPolicies->Insert( NewPPI(jpolTs, maxLBv ) );
    }

    if(_m_verboseness >= 2) 
        cout <<"Solved BG for t="<<ts<<". Max. expected value (including "
             <<"true expected reward up to this ts:"<<jpolPrevTs->GetPastReward()<<") is:"
             <<poolOfNextPolicies->Select()->GetValue() <<endl;

    delete(bg_ts);
    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);

}